

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RVOSimulator.cpp
# Opt level: O1

void __thiscall RVO::RVOSimulator::doStep(RVOSimulator *this)

{
  pointer ppAVar1;
  long lVar2;
  
  KdTree::buildAgentTree(this->kdTree_);
  ppAVar1 = (this->agents_).super__Vector_base<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(this->agents_).
                              super__Vector_base<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)ppAVar1) >> 3)) {
    lVar2 = 0;
    do {
      Agent::computeNeighbors(ppAVar1[lVar2]);
      Agent::computeNewVelocity
                ((this->agents_).super__Vector_base<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>.
                 _M_impl.super__Vector_impl_data._M_start[lVar2]);
      lVar2 = lVar2 + 1;
      ppAVar1 = (this->agents_).super__Vector_base<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
    } while (lVar2 < (int)((ulong)((long)(this->agents_).
                                         super__Vector_base<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)ppAVar1)
                          >> 3));
  }
  ppAVar1 = (this->agents_).super__Vector_base<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(this->agents_).
                              super__Vector_base<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)ppAVar1) >> 3)) {
    lVar2 = 0;
    do {
      Agent::update(ppAVar1[lVar2]);
      lVar2 = lVar2 + 1;
      ppAVar1 = (this->agents_).super__Vector_base<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
    } while (lVar2 < (int)((ulong)((long)(this->agents_).
                                         super__Vector_base<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)ppAVar1)
                          >> 3));
  }
  this->globalTime_ = this->timeStep_ + this->globalTime_;
  return;
}

Assistant:

void RVOSimulator::doStep()
	{
		kdTree_->buildAgentTree();

#ifdef _OPENMP
#pragma omp parallel for
#endif
		for (int i = 0; i < static_cast<int>(agents_.size()); ++i) {
			agents_[i]->computeNeighbors();
			agents_[i]->computeNewVelocity();
		}

#ifdef _OPENMP
#pragma omp parallel for
#endif
		for (int i = 0; i < static_cast<int>(agents_.size()); ++i) {
			agents_[i]->update();
		}

		globalTime_ += timeStep_;
	}